

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteConstant<float,int,float,duckdb::BinaryStandardOperatorWrapper,duckdb::RoundOperatorPrecision,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  int iVar1;
  float *pfVar2;
  double dVar3;
  double dVar4;
  float fVar5;
  
  duckdb::Vector::SetVectorType((VectorType)result);
  pfVar2 = *(float **)(result + 0x20);
  if (((*(byte **)(left + 0x28) == (byte *)0x0) || ((**(byte **)(left + 0x28) & 1) != 0)) &&
     ((*(byte **)(right + 0x28) == (byte *)0x0 || ((**(byte **)(right + 0x28) & 1) != 0)))) {
    fVar5 = **(float **)(left + 0x20);
    iVar1 = **(int **)(right + 0x20);
    if (iVar1 < 0) {
      dVar3 = pow(10.0,(double)-(float)iVar1);
      dVar4 = round((double)fVar5 / dVar3);
      dVar4 = dVar4 * dVar3;
      fVar5 = 0.0;
    }
    else {
      dVar3 = pow(10.0,(double)iVar1);
      dVar4 = round((double)fVar5 * dVar3);
      dVar4 = dVar4 / dVar3;
    }
    if ((ulong)ABS(dVar4) < 0x7ff0000000000000) {
      fVar5 = (float)dVar4;
    }
    *pfVar2 = fVar5;
    return;
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}